

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

int __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::hash_key(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
           *this,vec<16U,_float> *k)

{
  size_t sVar1;
  uint hash;
  vec<16U,_float> *k_local;
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  *this_local;
  
  sVar1 = hasher<crnlib::vec<16U,_float>_>::operator()
                    ((hasher<crnlib::vec<16U,_float>_> *)&this->field_0x14,k);
  return (uint)((int)sVar1 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
}

Assistant:

inline int hash_key(const Key& k) const
        {
            CRNLIB_ASSERT((1U << (32U - m_hash_shift)) == m_values.size());

            uint hash = static_cast<uint>(m_hasher(k));

            // Fibonacci hashing
            hash = (2654435769U * hash) >> m_hash_shift;

            CRNLIB_ASSERT(hash < m_values.size());
            return hash;
        }